

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_sizeof_CCtx(ZSTD_CCtx *cctx)

{
  ZSTD_localDict dict;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  ZSTD_CDict *pZVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  ZSTD_CCtx *cctx_local;
  
  if (cctx == (ZSTD_CCtx *)0x0) {
    cctx_local = (ZSTD_CCtx *)0x0;
  }
  else {
    pZVar6 = (ZSTD_CDict *)0x1478;
    if ((ZSTD_CCtx *)(cctx->workspace).workspace == cctx) {
      pZVar6 = (ZSTD_CDict *)0x0;
    }
    sVar7 = ZSTD_cwksp_sizeof(&cctx->workspace);
    uVar1 = (cctx->localDict).dict;
    uVar2 = (cctx->localDict).dictSize;
    uVar3 = (cctx->localDict).dictContentType;
    uVar4 = *(undefined4 *)&(cctx->localDict).field_0x1c;
    uVar5 = (cctx->localDict).cdict;
    dict._24_8_ = uVar5;
    dict.dictSize._4_4_ = uVar4;
    dict.dictSize._0_4_ = uVar3;
    dict.dict = (void *)uVar2;
    dict.dictBuffer = (void *)uVar1;
    dict.cdict = pZVar6;
    sVar8 = ZSTD_sizeof_localDict(dict);
    sVar9 = ZSTD_sizeof_mtctx(cctx);
    cctx_local = (ZSTD_CCtx *)((long)&pZVar6->dictContent + sVar9 + sVar8 + sVar7);
  }
  return (size_t)cctx_local;
}

Assistant:

size_t ZSTD_sizeof_CCtx(const ZSTD_CCtx* cctx)
{
    if (cctx==NULL) return 0;   /* support sizeof on NULL */
    /* cctx may be in the workspace */
    return (cctx->workspace.workspace == cctx ? 0 : sizeof(*cctx))
           + ZSTD_cwksp_sizeof(&cctx->workspace)
           + ZSTD_sizeof_localDict(cctx->localDict)
           + ZSTD_sizeof_mtctx(cctx);
}